

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

optional<google::protobuf::io::Printer::AnnotationRecord> *
google::protobuf::io::anon_unknown_4::
LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
          (optional<google::protobuf::io::Printer::AnnotationRecord> *__return_storage_ptr__,
          string_view var,
          Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
          frames)

{
  _Any_data *p_Var1;
  long lVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar3 = frames.len_;
  lVar2 = sVar3 + 1;
  p_Var1 = (_Any_data *)(frames.ptr_ + sVar3);
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) goto LAB_002342da;
    if (sVar3 == 0) {
      (anonymous_namespace)::LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>();
LAB_002342f5:
      std::__throw_bad_function_call();
    }
    local_40._M_len = var._M_len;
    local_40._M_str = var._M_str;
    if (*(long *)(p_Var1 + -1) == 0) goto LAB_002342f5;
    (**(code **)(p_Var1->_M_pod_data + -8))(__return_storage_ptr__,p_Var1 + -2,&local_40);
    p_Var1 = p_Var1 + -2;
  } while ((__return_storage_ptr__->
           super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>).
           _M_payload.
           super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
           .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged
           != true);
  if (lVar2 == 0) {
LAB_002342da:
    (__return_storage_ptr__->
    super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>)._M_payload.
    super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged = false
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::optional<T> LookupInFrameStack(
    absl::string_view var,
    absl::Span<std::function<absl::optional<T>(absl::string_view)>> frames) {
  for (size_t i = frames.size(); i >= 1; --i) {
    auto val = frames[i - 1](var);
    if (val.has_value()) {
      return val;
    }
  }
  return absl::nullopt;
}